

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnoui.c
# Opt level: O0

char * os_get_root_name(char *buf)

{
  char *pcVar1;
  char *in_RDI;
  char *rootname;
  char *local_10;
  char *local_8;
  
  local_10 = in_RDI;
  local_8 = in_RDI;
  do {
    if (*local_8 == '\0') {
      return local_10;
    }
    if (*local_8 == '/') {
LAB_001338f4:
      local_10 = local_8 + 1;
    }
    else if (*local_8 != '\0') {
      pcVar1 = strchr("",(int)*local_8);
      if (pcVar1 != (char *)0x0) goto LAB_001338f4;
    }
    local_8 = local_8 + 1;
  } while( true );
}

Assistant:

char *os_get_root_name(const char *buf)
{
    const char *rootname;
#ifdef MSDOS
    const char *orig = buf;
#endif

    /* scan the name for path separators */
    for (rootname = buf ; *buf != '\0' ; ++buf)
    {
        /* if this is a path separator, remember it */
        if (ispathchar(*buf))
        {
#ifdef MSDOS
            /* 
             *   if this is the last character in the name, and it's beyond
             *   the second character, assume it's a device name colon rather
             *   than a path separator colon 
             */
            if (*buf == ':' && buf > orig + 1 && buf[1] == '\0')
                continue;
#endif

            /* 
             *   It's a path separators - for now, assume the root will
             *   start at the next character after this separator.  If we
             *   find another separator later, we'll forget about this one
             *   and use the later one instead.  
             */
            rootname = buf + 1;
        }
    }

    /* 
     *   Return the last root name candidate that we found.  (Cast it to
     *   non-const for the caller's convenience: *we're* not allowed to
     *   modify this buffer, but the caller is certainly free to pass in a
     *   writable buffer, and they're free to write to it after we return.)  
     */
    return (char *)rootname;
}